

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.hpp
# Opt level: O3

void __thiscall
optimization::inlineFunc::Inline_Func::optimize_func
          (Inline_Func *this,string *funcId,MirFunction *func,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
          *funcTable)

{
  string *__k;
  pointer *ppuVar1;
  bool bVar2;
  uint32_t uVar3;
  CallInst *callInst;
  pointer puVar4;
  Inst *pIVar5;
  _Base_ptr p_Var6;
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *pmVar7;
  MirFunction *func_00;
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *this_00;
  int iVar8;
  JumpKind JVar9;
  _Base_ptr p_Var10;
  mapped_type *this_01;
  const_iterator cVar11;
  size_t sVar12;
  size_t sVar13;
  _Rb_tree_node_base *p_Var14;
  ostream *poVar15;
  mapped_type *pmVar16;
  long lVar17;
  mapped_type *pmVar18;
  mapped_type *pmVar19;
  ulong uVar20;
  Tag *tag;
  char *function;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *puVar21;
  pointer *__ptr;
  long lVar22;
  pointer puVar23;
  ulong uVar24;
  iterator __begin2;
  _Rb_tree_header *p_Var25;
  pointer puVar26;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *puVar27;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *j;
  set<int,_std::less<int>,_std::allocator<int>_> *psVar28;
  _Base_ptr p_Var29;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar30;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>,_std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  pVar31;
  int bb_true;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  start_blk_insts;
  mapped_type sub_start_id;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  end_blk_insts;
  int bb_false;
  mapped_type sub_end_id;
  Rewriter rwt;
  set<int,_std::less<int>,_std::allocator<int>_> base_labels;
  uint local_1fc;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  local_1f8;
  undefined8 uStack_1e0;
  mapped_type *local_1d8;
  _Rb_tree_node_base *local_1d0;
  char *local_1c8;
  _Base_ptr local_1c0;
  char local_1b8;
  undefined7 uStack_1b7;
  undefined8 uStack_1b0;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  local_1a8;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> local_190 [2];
  undefined1 local_180;
  MirFunction *local_178;
  int local_16c;
  _Base_ptr *local_168;
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *local_160;
  vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
  *local_158;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_150;
  _Base_ptr local_148;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_140;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
  *local_138;
  undefined **local_130;
  undefined8 local_128;
  undefined1 local_120;
  undefined1 local_118 [16];
  undefined1 local_108 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  _Alloc_hider local_f0;
  _Base_ptr local_e8;
  undefined1 local_e0 [16];
  size_t local_d0;
  bool local_c8;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  local_a8;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  local_90 [2];
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_138 = funcTable;
  iVar8 = std::__cxx11::string::compare((char *)&func->name);
  if ((iVar8 == 0) ||
     (((func->type).super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      is_extern != false)) {
    return;
  }
  p_Var10 = (func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1d8 = (mapped_type *)CONCAT44(local_1d8._4_4_,p_Var10[1]._M_color);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1d0 = &(func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var10 != local_1d0) {
    do {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_60,(int *)(p_Var10 + 1));
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
    } while (p_Var10 != local_1d0);
  }
  local_160 = &func->basic_blks;
  local_140 = &this->uninlineable_funcs;
  local_148 = &(this->uninlineable_funcs)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_150 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               *)&this->uninlined_funcs;
  local_178 = func;
LAB_00123260:
  p_Var14 = (local_178->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if (p_Var14 == local_1d0) {
LAB_00123ac5:
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_60);
      return;
    }
    if (((int)local_1d8 <= (int)p_Var14[1]._M_color) &&
       (p_Var10 = p_Var14[3]._M_parent, p_Var14[3]._M_left != p_Var10)) {
      local_158 = (vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                   *)&p_Var14[3]._M_parent;
      lVar22 = 8;
      uVar24 = 0;
LAB_001232b6:
      iVar8 = (**(code **)(**(long **)(&p_Var10->_M_color + uVar24 * 2) + 8))();
      if (iVar8 == 6) {
        callInst = *(CallInst **)(&p_Var10->_M_color + uVar24 * 2);
        this_01 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
                  ::at(local_138,&callInst->func);
        __k = &this_01->name;
        tag = (Tag *)__k;
        cVar11 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find(&local_140->_M_t,__k);
        if ((cVar11._M_node == local_148) &&
           (((this_01->type).super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->is_extern == false)) {
          sVar12 = mir::inst::MirFunction::variable_table_size(this_01);
          sVar13 = mir::inst::MirFunction::variable_table_size(local_178);
          if (sVar13 + sVar12 < 0x400) break;
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>(local_150,__k);
        }
      }
      uVar24 = uVar24 + 1;
      p_Var10 = p_Var14[3]._M_parent;
      lVar22 = lVar22 + 8;
      if ((ulong)((long)p_Var14[3]._M_left - (long)p_Var10 >> 3) <= uVar24) goto LAB_0012335b;
      goto LAB_001232b6;
    }
LAB_0012335b:
    p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
  } while( true );
  local_1fc = local_1fc & 0xffffff00;
  AixLog::operator<<((ostream *)&local_1fc,(Severity *)tag);
  local_1a8.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__Tag_001eaf88;
  local_1a8.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = local_190;
  local_1a8.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_190[0]._M_t.super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>.
  _M_t.super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
  super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl._0_1_ = 0;
  local_180 = 1;
  AixLog::operator<<((ostream *)&local_1a8,tag);
  func_00 = local_178;
  local_128 = std::chrono::_V2::system_clock::now();
  local_130 = &PTR__Timestamp_001eaf58;
  local_120 = 0;
  AixLog::operator<<((ostream *)&local_130,(Timestamp *)tag);
  local_1f8.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_1f8.
                 super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"optimize_func","");
  local_1c8 = &local_1b8;
  function = 
  "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/inline.hpp"
  ;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1c8,
             "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/inline.hpp"
             ,"");
  local_118._0_8_ = &PTR__Function_001eafb8;
  local_118._8_8_ = local_108 + 8;
  ppuVar1 = &local_1f8.
             super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (local_1f8.
      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start == (pointer)ppuVar1) {
    local_100._8_8_ = uStack_1e0;
  }
  else {
    local_118._8_8_ =
         local_1f8.
         super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  local_100._M_allocated_capacity =
       (size_type)
       local_1f8.
       super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_108 = (undefined1  [8])
              local_1f8.
              super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_1f8.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)local_1f8.
                        super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
  local_f0._M_p = local_e0;
  if (local_1c8 == &local_1b8) {
    local_e0._8_8_ = uStack_1b0;
  }
  else {
    local_f0._M_p = local_1c8;
  }
  local_e0._1_7_ = uStack_1b7;
  local_e0[0] = local_1b8;
  local_e8 = local_1c0;
  local_1c0 = (_Base_ptr)0x0;
  local_1b8 = '\0';
  local_d0 = 0x13d;
  local_c8 = false;
  local_1f8.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar1;
  local_1c8 = &local_1b8;
  AixLog::operator<<((ostream *)local_118,(Function *)function);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"( inline_func ) ",0x10);
  poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::clog,(func_00->name)._M_dataplus._M_p,
                       (func_00->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15," inlines ",9);
  poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar15,(this_01->name)._M_dataplus._M_p,(this_01->name)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
  std::ostream::put((char)poVar15);
  std::ostream::flush();
  AixLog::Function::~Function((Function *)local_118);
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,CONCAT71(uStack_1b7,local_1b8) + 1);
  }
  if (local_1f8.
      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&local_1f8.
                super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_1f8.
                    super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_1f8.
                                     super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_t).
                                   super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                   .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 1
                           ));
  }
  local_1a8.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__Tag_001eaf88;
  if (local_1a8.
      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != local_190) {
    operator_delete(local_1a8.
                    super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
                    CONCAT71(local_190[0]._M_t.
                             super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                             .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl._1_7_,
                             local_190[0]._M_t.
                             super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                             .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl._0_1_) +
                    1);
  }
  Rewriter::Rewriter((Rewriter *)local_118,func_00,this_01,callInst,*(int *)&p_Var14[1]._M_left);
  p_Var10 = (this_01->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var25 = &(this_01->basic_blks)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var10 != p_Var25) {
    do {
      Rewriter::cast_block((Rewriter *)local_118,(BasicBlk *)&p_Var10[1]._M_parent);
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
    } while ((_Rb_tree_header *)p_Var10 != p_Var25);
    p_Var10 = (this_01->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  pmVar16 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                      ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *
                       )(local_e0 + 8),(key_type *)(p_Var10 + 1));
  local_1c8 = (char *)CONCAT44(local_1c8._4_4_,*pmVar16);
  lVar17 = std::_Rb_tree_decrement(&p_Var25->_M_header);
  pmVar16 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                      ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *
                       )(local_e0 + 8),(key_type *)(lVar17 + 0x20));
  pmVar7 = local_160;
  local_130 = (undefined **)CONCAT44(local_130._4_4_,*pmVar16);
  local_1d8 = std::
              map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
              ::at(local_160,(key_type *)&local_1c8);
  local_1a8.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)0x0;
  local_1a8.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)0x0;
  local_1a8.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pmVar18 = std::
            map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
            ::at(pmVar7,(key_type *)&local_130);
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&local_60,
             (int *)&local_130);
  puVar4 = (pmVar18->inst).
           super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar26 = (pmVar18->inst).
                 super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      puVar23 = local_90[0].
                super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish, puVar26 != puVar4; puVar26 = puVar26 + 1
      ) {
    std::
    vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
    ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
              ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                *)&local_1a8,puVar26);
  }
  local_168 = &p_Var14[1]._M_left;
  for (puVar26 = local_90[0].
                 super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; uVar20 = uVar24, puVar26 != puVar23;
      puVar26 = puVar26 + 1) {
    std::
    vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
    ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
              ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                *)&local_1a8,puVar26);
  }
  while( true ) {
    if ((ulong)((long)p_Var14[3]._M_left - (long)p_Var14[3]._M_parent >> 3) <= uVar20 + 1) break;
    puVar21 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
              ((long)&(p_Var14[3]._M_parent)->_M_color + lVar22);
    lVar22 = lVar22 + 8;
    std::
    vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
    ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
              ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                *)&local_1a8,puVar21);
    uVar20 = uVar20 + 1;
  }
  puVar26 = (pmVar18->inst).
            super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = (pmVar18->inst).
           super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar23 = puVar26;
  puVar21 = local_1a8.
            super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar27 = local_1a8.
            super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pmVar7 = local_160;
  if (puVar4 != puVar26) {
    do {
      pIVar5 = (puVar23->_M_t).
               super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
               super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
               super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
      if (pIVar5 != (Inst *)0x0) {
        (*(pIVar5->super_Displayable)._vptr_Displayable[5])();
      }
      (puVar23->_M_t).super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>.
      _M_t.super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
      super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl = (Inst *)0x0;
      puVar23 = puVar23 + 1;
    } while (puVar23 != puVar4);
    (pmVar18->inst).
    super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar26;
    puVar21 = local_1a8.
              super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar27 = local_1a8.
              super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pmVar7 = local_160;
  }
  for (; this_00 = local_160,
      puVar26 = local_1a8.
                super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish, local_160 = pmVar7,
      puVar21 !=
      local_1a8.
      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; puVar21 = puVar21 + 1) {
    local_1a8.
    super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar27;
    std::
    vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
    ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
              ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                *)&pmVar18->inst,puVar21);
    puVar27 = local_1a8.
              super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pmVar7 = local_160;
    local_160 = this_00;
    local_1a8.
    super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar26;
  }
  p_Var10 = p_Var14[5]._M_parent;
  if ((char)p_Var14[5]._M_color == _S_red) {
    JVar9 = *(JumpKind *)&p_Var14[5]._M_left;
    (pmVar18->jump).kind = *(JumpInstructionKind *)&p_Var14[4]._M_parent;
    if ((pmVar18->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
        super__Optional_payload_base<mir::inst::VarId>._M_engaged != false) {
      (pmVar18->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_engaged = false;
    }
  }
  else {
    uVar3 = *(uint32_t *)&p_Var14[4]._M_right;
    JVar9 = *(JumpKind *)&p_Var14[5]._M_left;
    (pmVar18->jump).kind = *(JumpInstructionKind *)&p_Var14[4]._M_parent;
    if ((pmVar18->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
        super__Optional_payload_base<mir::inst::VarId>._M_engaged == false) {
      (pmVar18->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.super_Displayable.
      _vptr_Displayable = (_func_int **)&PTR_display_001eb100;
      (pmVar18->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id = uVar3;
      (pmVar18->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_engaged = true;
    }
    else {
      (pmVar18->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id = uVar3;
    }
  }
  *(_Base_ptr *)&(pmVar18->jump).bb_true = p_Var10;
  (pmVar18->jump).jump_kind = JVar9;
  local_1fc = *(uint *)&p_Var14[5]._M_parent;
  local_1a8.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = puVar27;
  if (local_1fc != 0xffffffff) {
    pmVar19 = std::
              map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
              ::at(this_00,(key_type *)&local_1fc);
    psVar28 = &pmVar19->preceding;
    pVar30 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
             equal_range(&psVar28->_M_t,(key_type *)local_168);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_M_erase_aux
              (&psVar28->_M_t,(_Base_ptr)pVar30.first._M_node,(_Base_ptr)pVar30.second._M_node);
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)psVar28,
               &pmVar18->id);
  }
  local_16c = *(int *)((long)&p_Var14[5]._M_parent + 4);
  if (local_16c != -1) {
    pmVar19 = std::
              map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
              ::at(this_00,&local_16c);
    psVar28 = &pmVar19->preceding;
    pVar30 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
             equal_range(&psVar28->_M_t,(key_type *)local_168);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_M_erase_aux
              (&psVar28->_M_t,(_Base_ptr)pVar30.first._M_node,(_Base_ptr)pVar30.second._M_node);
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)psVar28,
               &pmVar18->id);
  }
  local_1f8.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)0x0;
  local_1f8.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)0x0;
  local_1f8.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (uVar24 != 0) {
    lVar22 = 0;
    do {
      std::
      vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
      ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                  *)&local_1f8,
                 (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                 ((long)&(*(_Base_ptr *)local_158)->_M_color + lVar22));
      lVar22 = lVar22 + 8;
      uVar24 = uVar24 - 1;
    } while (uVar24 != 0);
  }
  puVar26 = local_a8.
            super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar21 = local_a8.
                 super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar21 != puVar26;
      puVar21 = puVar21 + 1) {
    std::
    vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
    ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
              ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                *)&local_1f8,puVar21);
  }
  puVar4 = (local_1d8->inst).
           super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar26 = (local_1d8->inst).
                 super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar26 != puVar4; puVar26 = puVar26 + 1
      ) {
    std::
    vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
    ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
              ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                *)&local_1f8,puVar26);
  }
  p_Var10 = p_Var14[3]._M_parent;
  p_Var6 = p_Var14[3]._M_left;
  puVar27 = local_1f8.
            super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  p_Var29 = p_Var10;
  puVar21 = local_1f8.
            super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (p_Var6 != p_Var10) {
    do {
      if (*(long **)p_Var29 != (long *)0x0) {
        (**(code **)(**(long **)p_Var29 + 0x28))();
      }
      *(long *)p_Var29 = 0;
      p_Var29 = (_Base_ptr)&p_Var29->_M_parent;
    } while (p_Var29 != p_Var6);
    p_Var14[3]._M_left = p_Var10;
    puVar27 = local_1f8.
              super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar21 = local_1f8.
              super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  for (; puVar27 != puVar21; puVar27 = puVar27 + 1) {
    std::
    vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
    ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
              (local_158,puVar27);
  }
  p_Var10 = *(_Base_ptr *)&(local_1d8->jump).bb_true;
  bVar2 = (local_1d8->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>.
          _M_payload.super__Optional_payload_base<mir::inst::VarId>._M_engaged;
  uVar3 = (local_1d8->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>.
          _M_payload.super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id;
  JVar9 = (local_1d8->jump).jump_kind;
  *(JumpInstructionKind *)&p_Var14[4]._M_parent = (local_1d8->jump).kind;
  if ((char)p_Var14[5]._M_color == _S_red) {
    if (bVar2 != false) {
      p_Var14[4]._M_left = (_Base_ptr)&PTR_display_001eb100;
      *(uint32_t *)&p_Var14[4]._M_right = uVar3;
      *(undefined1 *)&p_Var14[5]._M_color = _S_black;
    }
  }
  else if (bVar2 == false) {
    *(undefined1 *)&p_Var14[5]._M_color = _S_red;
  }
  else {
    *(uint32_t *)&p_Var14[4]._M_right = uVar3;
  }
  p_Var14[5]._M_parent = p_Var10;
  *(JumpKind *)&p_Var14[5]._M_left = JVar9;
  pVar31 = std::
           _Rb_tree<int,_std::pair<const_int,_mir::inst::BasicBlk>,_std::_Select1st<std::pair<const_int,_mir::inst::BasicBlk>_>,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
           ::equal_range(&this_00->_M_t,(key_type *)&local_1c8);
  std::
  _Rb_tree<int,_std::pair<const_int,_mir::inst::BasicBlk>,_std::_Select1st<std::pair<const_int,_mir::inst::BasicBlk>_>,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar31.first._M_node,(_Base_ptr)pVar31.second._M_node);
  std::
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ::~vector(&local_1f8);
  std::
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ::~vector(&local_1a8);
  std::
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ::~vector(local_90);
  std::
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ::~vector(&local_a8);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)(local_e0 + 8));
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)local_108);
  local_1d8 = (mapped_type *)CONCAT44(local_1d8._4_4_,p_Var14[1]._M_color);
  if (p_Var14 == local_1d0) goto LAB_00123ac5;
  goto LAB_00123260;
}

Assistant:

void optimize_func(std::string funcId, mir::inst::MirFunction& func,
                     std::map<std::string, mir::inst::MirFunction>& funcTable) {
    if (func.name == "main" || func.type->is_extern) {
      return;
    }
    int cur_blkId = func.basic_blks.begin()->first;
    std::set<mir::types::LabelId> base_labels;
    for (auto& iter : func.basic_blks) {
      base_labels.insert(iter.first);
    }
    while (true) {
      auto iter = func.basic_blks.begin();
      for (; iter != func.basic_blks.end(); ++iter) {
        bool flag = false;
        if (iter->first < cur_blkId) {
          // if (iter->first < cur_blkId || !base_labels.count(iter->first)) {

          continue;
        }
        auto& insts = iter->second.inst;
        auto& cur_blk = iter->second;
        for (int i = 0; i < insts.size(); i++) {
          auto& inst = insts[i];
          if (inst->inst_kind() != mir::inst::InstKind::Call) {
            continue;
          }
          auto& iptr = *inst;
          auto callInst = dynamic_cast<mir::inst::CallInst*>(&iptr);
          auto& subfunc = funcTable.at(callInst->func);
          if (uninlineable_funcs.count(subfunc.name)) {
            continue;
          }
          if (subfunc.type->is_extern) {
            continue;
          }
          if (subfunc.variable_table_size() + func.variable_table_size() >=
              1024) {
            uninlined_funcs.insert(subfunc.name);
            continue;
          }
          //  Then this func is inlineable
          LOG(TRACE) << "( inline_func ) " << func.name << " inlines "
                     << subfunc.name << std::endl;
          Rewriter rwt(func, subfunc, *callInst, cur_blk.id);
          for (auto& pair : subfunc.basic_blks) {
            rwt.cast_block(pair.second);
          }
          auto sub_start_id =
              rwt.label_cast_map.at(subfunc.basic_blks.begin()->first);
          auto end_iter = subfunc.basic_blks.end();
          end_iter--;
          auto sub_end_id = rwt.label_cast_map.at(end_iter->first);
          auto& start_blk = func.basic_blks.at(sub_start_id);

          std::vector<std::unique_ptr<mir::inst::Inst>> end_blk_insts;
          auto& end_blk = func.basic_blks.at(sub_end_id);
          base_labels.insert(sub_end_id);
          for (auto& j : end_blk.inst) {
            end_blk_insts.push_back(std::move(j));
          }

          for (auto& j : rwt.init_inst_after) {
            end_blk_insts.push_back(std::move(j));
          }
          for (int j = i + 1; j < insts.size(); j++) {
            end_blk_insts.push_back(std::move(insts[j]));
          }
          end_blk.inst.clear();
          for (auto& j : end_blk_insts) {
            end_blk.inst.push_back(std::move(j));
          }
          end_blk.jump = mir::inst::JumpInstruction(
              cur_blk.jump.kind, cur_blk.jump.bb_true, cur_blk.jump.bb_false,
              cur_blk.jump.cond_or_ret, cur_blk.jump.jump_kind);
          int bb_true = cur_blk.jump.bb_true;
          if (bb_true != -1) {
            auto& blk = func.basic_blks.at(bb_true);
            blk.preceding.erase(cur_blk.id);
            blk.preceding.insert(end_blk.id);
          }
          int bb_false = cur_blk.jump.bb_false;
          if (bb_false != -1) {
            auto& blk = func.basic_blks.at(bb_false);
            blk.preceding.erase(cur_blk.id);
            blk.preceding.insert(end_blk.id);
          }

          std::vector<std::unique_ptr<mir::inst::Inst>> start_blk_insts;
          for (int j = 0; j < i; j++) {
            start_blk_insts.push_back(std::move(insts[j]));
          }
          for (auto& j : rwt.init_inst_before) {
            start_blk_insts.push_back(std::move(j));
          }
          for (auto& j : start_blk.inst) {
            start_blk_insts.push_back(std::move(j));
          }
          cur_blk.inst.clear();
          for (auto& j : start_blk_insts) {
            cur_blk.inst.push_back(std::move(j));
          }
          cur_blk.jump = mir::inst::JumpInstruction(
              start_blk.jump.kind, start_blk.jump.bb_true,
              start_blk.jump.bb_false, start_blk.jump.cond_or_ret,
              start_blk.jump.jump_kind);

          flag = true;
          func.basic_blks.erase(sub_start_id);
          break;
        }
        if (flag) {
          cur_blkId = iter->first;
          break;
        }
      }
      if (iter == func.basic_blks.end()) {
        break;
      }
    }
  }